

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

InplaceStr
GetDefaultArgumentWrapperFunctionName
          (ExpressionContext *ctx,FunctionData *function,InplaceStr argumentName)

{
  char *pcVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  char *name;
  uint length;
  FunctionData *function_local;
  ExpressionContext *ctx_local;
  InplaceStr argumentName_local;
  
  argumentName_local.begin = argumentName.end;
  ctx_local = (ExpressionContext *)argumentName.begin;
  uVar2 = InplaceStr::length(&function->name->name);
  uVar3 = InplaceStr::length((InplaceStr *)&ctx_local);
  uVar3 = uVar2 + 0x10 + uVar3;
  iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,(ulong)uVar3);
  pcVar1 = (function->name->name).begin;
  NULLC::SafeSprintf((char *)CONCAT44(extraout_var,iVar4),(ulong)uVar3,"%.*s_%u_%.*s$",
                     (ulong)(uint)(*(int *)&(function->name->name).end - (int)pcVar1),pcVar1,
                     (ulong)(function->type->super_TypeBase).nameHash,
                     (int)argumentName_local.begin - (int)ctx_local,ctx_local);
  InplaceStr::InplaceStr((InplaceStr *)&argumentName_local.end,(char *)CONCAT44(extraout_var,iVar4))
  ;
  return stack0xffffffffffffffe8;
}

Assistant:

InplaceStr GetDefaultArgumentWrapperFunctionName(ExpressionContext &ctx, FunctionData *function, InplaceStr argumentName)
{
	unsigned length = function->name->name.length() + argumentName.length() + 16;
	char *name = (char*)ctx.allocator->alloc(length);
	NULLC::SafeSprintf(name, length, "%.*s_%u_%.*s$", FMT_ISTR(function->name->name), function->type->nameHash, FMT_ISTR(argumentName));

	return InplaceStr(name);
}